

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::segmentcheck(string *unit,char closeSegment,size_t *index)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong *in_RDX;
  char in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char close;
  char current;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffde;
  char mchar;
  undefined7 in_stack_ffffffffffffffe8;
  
LAB_0079ed95:
  do {
    while( true ) {
      while( true ) {
        uVar1 = *in_RDX;
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(in_RDI);
        if (sVar3 <= uVar1) {
          return false;
        }
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        mchar = *pvVar4;
        *in_RDX = *in_RDX + 1;
        if (mchar == in_SIL) {
          return true;
        }
        if ((mchar != '\"') && (mchar != '(')) break;
        in_stack_ffffffffffffffc0 = in_RDI;
        getMatchCharacter(mchar);
        bVar2 = segmentcheck((string *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                             (char)((ulong)in_RDX >> 0x38),
                             (size_t *)
                             CONCAT17(mchar,CONCAT16(in_stack_ffffffffffffffde,
                                                     in_stack_ffffffffffffffd8)));
        if (!bVar2) {
          return false;
        }
      }
      if (mchar == ')') {
        return false;
      }
      if (mchar != '[') break;
LAB_0079eeb3:
      in_stack_ffffffffffffffde = getMatchCharacter(mchar);
      if (in_stack_ffffffffffffffde == in_SIL) {
        return false;
      }
      bVar2 = segmentcheck((string *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),
                           (char)((ulong)in_RDX >> 0x38),
                           (size_t *)
                           CONCAT17(mchar,CONCAT16(in_stack_ffffffffffffffde,
                                                   in_stack_ffffffffffffffd8)));
      if (!bVar2) {
        return false;
      }
    }
    if (mchar == '\\') {
      *in_RDX = *in_RDX + 1;
      goto LAB_0079ed95;
    }
    if (mchar == ']') {
      return false;
    }
    if (mchar == '{') goto LAB_0079eeb3;
    if (mchar == '}') {
      return false;
    }
  } while( true );
}

Assistant:

static bool
    segmentcheck(const std::string& unit, char closeSegment, size_t& index)
{
    while (index < unit.size()) {
        char current = unit[index];
        ++index;
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '\\':
                ++index;
                break;
            case '(':
            case '"':
                if (!segmentcheck(unit, getMatchCharacter(current), index)) {
                    return false;
                }
                break;
            case '{':
            case '[': {
                auto close = getMatchCharacter(current);
                if (close == closeSegment) {
                    return false;
                }
                if (!segmentcheck(unit, close, index)) {
                    return false;
                }
                break;
            }
            case '}':
            case ')':
            case ']':
                return false;
            default:
                break;
        }
    }
    return false;
}